

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall cmGlobalUnixMakefileGenerator3::Generate(cmGlobalUnixMakefileGenerator3 *this)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  size_type sVar4;
  reference ppcVar5;
  cmMakefile *this_00;
  char *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  undefined1 local_2e0 [8];
  cmGeneratedFileStream markFile;
  allocator local_81;
  string local_80 [8];
  string markFileName;
  cmLocalUnixMakefileGenerator3 *lg;
  iterator iStack_50;
  uint i;
  _Self local_48;
  iterator pmi_1;
  unsigned_long current;
  _Rb_tree_const_iterator<std::pair<const_cmTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
  local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_cmTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
  local_20;
  const_iterator pmi;
  unsigned_long total;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  cmGlobalGenerator::Generate(&this->super_cmGlobalGenerator);
  pmi._M_node = (_Base_ptr)0x0;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_cmTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
       ::begin(&this->ProgressMap);
  std::
  _Rb_tree_const_iterator<std::pair<const_cmTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
  ::_Rb_tree_const_iterator(&local_20,&local_28);
  while( true ) {
    current = (unsigned_long)
              std::
              map<const_cmTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
              ::end(&this->ProgressMap);
    std::
    _Rb_tree_const_iterator<std::pair<const_cmTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
    ::_Rb_tree_const_iterator(&local_30,(iterator *)&current);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_cmTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
             ::operator->(&local_20);
    pmi._M_node = (_Base_ptr)((long)&(pmi._M_node)->_M_color + (ppVar2->second).NumberOfActions);
    std::
    _Rb_tree_const_iterator<std::pair<const_cmTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
    ::operator++(&local_20);
  }
  pmi_1._M_node = (_Base_ptr)0x0;
  local_48._M_node =
       (_Base_ptr)
       std::
       map<const_cmTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
       ::begin(&this->ProgressMap);
  while( true ) {
    iStack_50 = std::
                map<const_cmTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
                ::end(&this->ProgressMap);
    bVar1 = std::operator!=(&local_48,&stack0xffffffffffffffb0);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
             ::operator->(&local_48);
    TargetProgress::WriteProgressVariables
              (&ppVar3->second,(unsigned_long)pmi._M_node,(unsigned_long *)&pmi_1);
    std::
    _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
    ::operator++(&local_48);
  }
  lg._4_4_ = 0;
  while( true ) {
    sVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                      (&(this->super_cmGlobalGenerator).LocalGenerators);
    if (sVar4 <= lg._4_4_) break;
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&(this->super_cmGlobalGenerator).LocalGenerators,(ulong)lg._4_4_);
    markFileName.field_2._8_8_ = *ppcVar5;
    this_00 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)markFileName.field_2._8_8_);
    pcVar6 = cmMakefile::GetCurrentBinaryDirectory(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pcVar6,&local_81);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::operator+=(local_80,"/");
    pcVar6 = cmake::GetCMakeFilesDirectory();
    std::__cxx11::string::operator+=(local_80,pcVar6);
    std::__cxx11::string::operator+=(local_80,"/progress.marks");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_2e0,pcVar6,false);
    sVar7 = CountProgressMarksInAll
                      (this,(cmLocalUnixMakefileGenerator3 *)markFileName.field_2._8_8_);
    poVar8 = (ostream *)std::ostream::operator<<(local_2e0,sVar7);
    std::operator<<(poVar8,"\n");
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2e0);
    std::__cxx11::string::~string(local_80);
    lg._4_4_ = lg._4_4_ + 1;
  }
  WriteMainMakefile2(this);
  WriteMainCMakefile(this);
  if (this->CommandDatabase != (cmGeneratedFileStream *)0x0) {
    poVar8 = (ostream *)
             std::ostream::operator<<(this->CommandDatabase,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar8,"]");
    if (this->CommandDatabase != (cmGeneratedFileStream *)0x0) {
      (*(this->CommandDatabase->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream[1])();
    }
    this->CommandDatabase = (cmGeneratedFileStream *)0x0;
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::Generate()
{
  // first do superclass method
  this->cmGlobalGenerator::Generate();

  // initialize progress
  unsigned long total = 0;
  for(ProgressMapType::const_iterator pmi = this->ProgressMap.begin();
      pmi != this->ProgressMap.end(); ++pmi)
    {
    total += pmi->second.NumberOfActions;
    }

  // write each target's progress.make this loop is done twice. Bascially the
  // Generate pass counts all the actions, the first loop below determines
  // how many actions have progress updates for each target and writes to
  // corrrect variable values for everything except the all targets. The
  // second loop actually writes out correct values for the all targets as
  // well. This is because the all targets require more information that is
  // computed in the first loop.
  unsigned long current = 0;
  for(ProgressMapType::iterator pmi = this->ProgressMap.begin();
      pmi != this->ProgressMap.end(); ++pmi)
    {
    pmi->second.WriteProgressVariables(total, current);
    }
  for(unsigned int i = 0; i < this->LocalGenerators.size(); ++i)
    {
    cmLocalUnixMakefileGenerator3 *lg =
      static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[i]);
    std::string markFileName = lg->GetMakefile()->GetCurrentBinaryDirectory();
    markFileName += "/";
    markFileName += cmake::GetCMakeFilesDirectory();
    markFileName += "/progress.marks";
    cmGeneratedFileStream markFile(markFileName.c_str());
    markFile << this->CountProgressMarksInAll(lg) << "\n";
    }

  // write the main makefile
  this->WriteMainMakefile2();
  this->WriteMainCMakefile();

  if (this->CommandDatabase != NULL) {
    *this->CommandDatabase << std::endl << "]";
    delete this->CommandDatabase;
    this->CommandDatabase = NULL;
  }
}